

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

Gia_Man_t *
Str_NtkBalance(Gia_Man_t *pGia,Str_Ntk_t *p,int nLutSize,int fUseMuxes,int fRecursive,int fOptArea,
              int fVerbose)

{
  int *__ptr;
  int iVar1;
  uint uVar2;
  int iLit0;
  Gia_Man_t *p_00;
  char *pcVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  Str_Obj_t *pSVar6;
  Str_Obj_t *pSVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  Str_Obj_t *pObj;
  float fVar11;
  uint local_54;
  
  if (0xf < nLutSize) {
    __assert_fail("nLutSize < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x50e,
                  "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
  }
  if (pGia->pMuxes != (uint *)0x0) {
    __assert_fail("pGia->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x50f,
                  "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
  }
  p_00 = Gia_ManStart(pGia->nObjs);
  pcVar3 = Abc_UtilStrsav(pGia->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pGia->pSpec);
  p_00->pSpec = pcVar3;
  iVar1 = p_00->nObjsAlloc;
  puVar4 = (uint *)calloc((long)iVar1,4);
  p_00->pMuxes = puVar4;
  Vec_IntFill(&p_00->vCopies,iVar1,-1);
  if (p_00->vSuper == (Vec_Int_t *)0x0) {
    pVVar5 = Vec_IntAlloc(1000);
    p_00->vSuper = pVVar5;
  }
  if (p_00->vStore == (Vec_Int_t *)0x0) {
    pVVar5 = Vec_IntAlloc(1000);
    p_00->vStore = pVVar5;
  }
  iVar1 = p_00->nObjsAlloc;
  iVar10 = iVar1 * 2;
  pVVar5 = Vec_IntAlloc(iVar10);
  pVVar5->nSize = iVar10;
  if (pVVar5->pArray != (int *)0x0) {
    memset(pVVar5->pArray,0,(long)iVar1 << 3);
  }
  Gia_ManHashStart(p_00);
  if ((Tim_Man_t *)pGia->pManTime != (Tim_Man_t *)0x0) {
    Tim_ManInitPiArrivalAll((Tim_Man_t *)pGia->pManTime,17.0);
    Tim_ManIncrementTravId((Tim_Man_t *)pGia->pManTime);
  }
  pSVar6 = p->pObjs;
  local_54 = 0;
  pObj = pSVar6;
  do {
    if (p->nObjs <= (int)((ulong)((long)pObj - (long)pSVar6) >> 4)) {
      if (fVerbose != 0) {
        printf("Max delay = %d.  Old objs = %d.  New objs = %d.\n",(ulong)(local_54 >> 4),
               (ulong)(uint)pGia->nObjs,(ulong)(uint)p_00->nObjs);
      }
      Vec_IntFree(pVVar5);
      __ptr = (p_00->vCopies).pArray;
      if (__ptr != (int *)0x0) {
        free(__ptr);
        (p_00->vCopies).pArray = (int *)0x0;
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,pGia->nRegs);
      pGVar9 = Gia_ManDupNoMuxes(p_00,0);
      Gia_ManStop(p_00);
      return pGVar9;
    }
    switch(*(uint *)pObj & 0xf) {
    case 1:
      pObj->iCopy = 0;
      iVar1 = 0;
      iVar10 = 0x11;
      goto LAB_0064a1a1;
    case 2:
      iVar1 = Gia_ManAppendCi(p_00);
      pObj->iCopy = iVar1;
      if (pGia->pManTime == (void *)0x0) {
        iVar10 = 0x11;
      }
      else {
        iVar1 = Abc_Lit2Var(iVar1);
        pGVar8 = Gia_ManObj(p_00,iVar1);
        iVar1 = Gia_ObjCioId(pGVar8);
        fVar11 = Tim_ManGetCiArrival((Tim_Man_t *)pGia->pManTime,iVar1);
        iVar10 = (int)fVar11;
        iVar1 = pObj->iCopy;
      }
      iVar1 = Abc_Lit2Var(iVar1);
LAB_0064a1a1:
      Vec_IntWriteEntry(pVVar5,iVar1,iVar10);
      break;
    case 3:
    case 4:
      Str_NtkBalanceMulti(p_00,p,pObj,pVVar5,nLutSize);
      break;
    case 5:
      if (fUseMuxes != 0) {
        iVar1 = pObj->iTop;
        if (-1 < iVar1) {
          if (iVar1 == 0) {
            iVar1 = 0;
            iVar10 = 0;
          }
          else {
            pSVar6 = Str_NtkObj(p,iVar1);
            pSVar7 = Str_NtkObj(p,pSVar6->iTop);
            iVar10 = (int)((ulong)((long)pSVar6 - (long)pObj) >> 4) + 1;
            iVar1 = (int)((((long)pSVar7 - (long)pObj >> 4) + 1) / (long)iVar10);
          }
          if (iVar10 * iVar1 < 2) {
            __assert_fail("nGroups * nMuxes >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                          ,0x532,
                          "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)"
                         );
          }
          Str_NtkBalanceMux(p_00,p,pObj,pVVar5,nLutSize,iVar1,iVar10,fRecursive,fOptArea,fVerbose);
          pObj = pObj + (iVar10 * iVar1 - 1);
          break;
        }
      }
      iVar1 = Str_ObjFaninCopy(p,pObj,2);
      iVar10 = Str_ObjFaninCopy(p,pObj,1);
      iLit0 = Str_ObjFaninCopy(p,pObj,0);
      iVar1 = Gia_ManHashMuxReal(p_00,iVar1,iVar10,iLit0);
      pObj->iCopy = iVar1;
      iVar1 = Abc_Lit2Var(iVar1);
      Str_ObjDelay(p_00,iVar1,nLutSize,pVVar5);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x548,
                    "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
    case 7:
      iVar1 = Str_ObjFaninCopy(p,pObj,0);
      iVar1 = Gia_ManAppendCo(p_00,iVar1);
      pObj->iCopy = iVar1;
      iVar1 = Str_ObjFaninCopy(p,pObj,0);
      iVar1 = Abc_Lit2Var(iVar1);
      uVar2 = Vec_IntEntry(pVVar5,iVar1);
      if ((int)local_54 <= (int)uVar2) {
        local_54 = uVar2;
      }
      if (pGia->pManTime != (void *)0x0) {
        iVar1 = Abc_Lit2Var(pObj->iCopy);
        pGVar8 = Gia_ManObj(p_00,iVar1);
        iVar1 = Gia_ObjCioId(pGVar8);
        Tim_ManSetCoArrival((Tim_Man_t *)pGia->pManTime,iVar1,(float)(int)uVar2);
      }
    }
    pObj = pObj + 1;
    pSVar6 = p->pObjs;
  } while( true );
}

Assistant:

Gia_Man_t * Str_NtkBalance( Gia_Man_t * pGia, Str_Ntk_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vDelay;
    Str_Obj_t * pObj; 
    int nGroups, nMuxes, CioId;
    int arrTime, Delay = 0;
    assert( nLutSize < 16 );
    assert( pGia->pMuxes == NULL );
    pNew = Gia_ManStart( Gia_ManObjNum(pGia) );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Vec_IntFill( &pNew->vCopies, pNew->nObjsAlloc, -1 );
    if ( pNew->vSuper == NULL )
        pNew->vSuper = Vec_IntAlloc( 1000 );
    if ( pNew->vStore == NULL )
        pNew->vStore = Vec_IntAlloc( 1000 );
    vDelay = Vec_IntStart( 2*pNew->nObjsAlloc );
    Gia_ManHashStart( pNew );
    if ( pGia->pManTime != NULL ) // Tim_Man with unit delay 16
    {
        Tim_ManInitPiArrivalAll( (Tim_Man_t *)pGia->pManTime, 17 );
        Tim_ManIncrementTravId( (Tim_Man_t *)pGia->pManTime );
    }
    Str_NtkManForEachObj( p, pObj )
    {
        if ( pObj->Type == STR_PI )
        {
            pObj->iCopy = Gia_ManAppendCi( pNew );
            arrTime = 17;
            if ( pGia->pManTime != NULL )
            {
                CioId = Gia_ObjCioId( Gia_ManObj(pNew, Abc_Lit2Var(pObj->iCopy)) );
                arrTime = (int)Tim_ManGetCiArrival( (Tim_Man_t *)pGia->pManTime, CioId );
            }
            Vec_IntWriteEntry( vDelay, Abc_Lit2Var(pObj->iCopy), arrTime );
        }
        else if ( pObj->Type == STR_AND || pObj->Type == STR_XOR )
            Str_NtkBalanceMulti( pNew, p, pObj, vDelay, nLutSize );
        else if ( pObj->Type == STR_MUX && pObj->iTop >= 0 && fUseMuxes )
        {
            Str_ObjReadGroup( p, pObj, &nGroups, &nMuxes );
            assert( nGroups * nMuxes >= 2 );
            Str_NtkBalanceMux( pNew, p, pObj, vDelay, nLutSize, nGroups, nMuxes, fRecursive, fOptArea, fVerbose );
            pObj += nGroups * nMuxes - 1;
        }
        else if ( pObj->Type == STR_MUX )
        {
            pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
            Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
        }
        else if ( pObj->Type == STR_PO )
        {
            pObj->iCopy = Gia_ManAppendCo( pNew, Str_ObjFaninCopy(p, pObj, 0) );
            arrTime = Vec_IntEntry(vDelay, Abc_Lit2Var(Str_ObjFaninCopy(p, pObj, 0)) );
            Delay = Abc_MaxInt( Delay, arrTime );
            if ( pGia->pManTime != NULL )
            {
                CioId = Gia_ObjCioId( Gia_ManObj(pNew, Abc_Lit2Var(pObj->iCopy)) );
                Tim_ManSetCoArrival( (Tim_Man_t *)pGia->pManTime, CioId, (float)arrTime );
            }
        }
        else if ( pObj->Type == STR_CONST0 )
            pObj->iCopy = 0, Vec_IntWriteEntry(vDelay, 0, 17);
        else assert( 0 );
    }
    if ( fVerbose )
        printf( "Max delay = %d.  Old objs = %d.  New objs = %d.\n", Delay >> 4, Gia_ManObjNum(pGia), Gia_ManObjNum(pNew) );
    Vec_IntFree( vDelay );
    ABC_FREE( pNew->vCopies.pArray );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    pNew = Gia_ManDupNoMuxes( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
//    if ( pGia->pManTime != NULL )
//        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)pGia->pManTime, 0 );
    return pNew;
}